

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack10_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x3ff;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001aa330);
  auVar4._8_4_ = 0x3ff;
  auVar4._0_8_ = 0x3ff000003ff;
  auVar4._12_4_ = 0x3ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  uVar2 = in[1];
  *(long *)(out + 1) = auVar3._0_8_;
  out[3] = uVar1 >> 0x1e;
  out[3] = uVar1 >> 0x1e | (uVar2 & 0xff) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001aa340);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 4) = auVar3._0_8_;
  out[6] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[6] = uVar2 >> 0x1c | (uVar1 & 0x3f) << 4;
  out[7] = uVar1 >> 6 & 0x3ff;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack10_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;

  return in + 1;
}